

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rk_list.cpp
# Opt level: O2

RK_S32 __thiscall rk_list::del_at_head(rk_list *this,void *data,RK_S32 size)

{
  RK_S32 RVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)this);
  RVar1 = -0x16;
  if ((this->head != (rk_list_node *)0x0) && (this->count != 0)) {
    _list_del_node_no_lock(this->head->next,data,size);
    this->count = this->count + -1;
    RVar1 = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return RVar1;
}

Assistant:

RK_S32 rk_list::del_at_head(void *data, RK_S32 size)
{
    RK_S32 ret = -EINVAL;
    pthread_mutex_lock(&mutex);
    if (head && count) {
        _list_del_node_no_lock(head->next, data, size);
        count--;
        ret = 0;
    }
    pthread_mutex_unlock(&mutex);
    return ret;
}